

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O0

char * borg_restock_dynamic(int depth)

{
  int *piVar1;
  _Bool _Var2;
  borg_depth_line *d;
  int i;
  int depth_local;
  
  d._0_4_ = 0;
  while (((int)d < borg_formulas.restock.count &&
         (piVar1 = (int *)borg_formulas.restock.items[(int)d], *piVar1 <= depth))) {
    _Var2 = check_condition(*(math_section **)(piVar1 + 4),depth);
    if (_Var2) {
      return *(char **)(piVar1 + 2);
    }
    d._0_4_ = (int)d + 1;
  }
  return (char *)0x0;
}

Assistant:

const char *borg_restock_dynamic(int depth)
{
    int i;

    for (i = 0; i < borg_formulas.restock.count; i++) {
        struct borg_depth_line *d = borg_formulas.restock.items[i];
        if (d->dlevel > depth)
            break;
        if (check_condition(d->condition, depth))
            return d->reason;
    }

    return NULL;
}